

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

cmFileList * __thiscall cmFileList::operator/(cmFileList *this,cmFileListGeneratorBase *rhs)

{
  cmFileListGeneratorBase *pcVar1;
  pointer pcVar2;
  unique_ptr<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>_> local_20;
  cmFileListGeneratorBase *local_18;
  cmFileListGeneratorBase *rhs_local;
  cmFileList *this_local;
  
  local_18 = rhs;
  rhs_local = (cmFileListGeneratorBase *)this;
  if (this->Last == (cmFileListGeneratorBase *)0x0) {
    (*rhs->_vptr_cmFileListGeneratorBase[3])(&local_20);
    std::unique_ptr<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>_>::
    operator=(&this->First,&local_20);
    std::unique_ptr<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>_>::
    ~unique_ptr(&local_20);
    pcVar2 = std::unique_ptr<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>_>
             ::get(&this->First);
    this->Last = pcVar2;
  }
  else {
    pcVar1 = cmFileListGeneratorBase::SetNext(this->Last,rhs);
    this->Last = pcVar1;
  }
  return this;
}

Assistant:

cmFileList& operator/(cmFileListGeneratorBase const& rhs)
  {
    if (this->Last) {
      this->Last = this->Last->SetNext(rhs);
    } else {
      this->First = rhs.Clone();
      this->Last = this->First.get();
    }
    return *this;
  }